

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

double * __thiscall skiwi::scm_type::flonum_address(scm_type *this)

{
  bool bVar1;
  uint64_t *puVar2;
  runtime_error *this_00;
  
  bVar1 = is_flonum(this);
  if (bVar1) {
    puVar2 = get_address_from_block(this->scm_value);
    return (double *)(puVar2 + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"skiwi error: not a flonum");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double* scm_type::flonum_address() const
  {
  if (!is_flonum())
    throw std::runtime_error("skiwi error: not a flonum");
  uint64_t* addr = get_address_from_block(scm_value);
  double* d = reinterpret_cast<double*>((uint64_t*)(addr + 1));
  return d;
  }